

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Statement * routineStatement(Statement *__return_storage_ptr__,Compiler *compiler)

{
  size_t sVar1;
  Token t;
  Token t_00;
  char *pcVar2;
  char **__ptr;
  int iVar3;
  bool bVar4;
  Block BVar5;
  undefined1 in_stack_ffffffffffffff70 [16];
  Token local_70;
  Token local_50;
  
  __return_storage_ptr__->type = STATEMENT_ROUTINE;
  (__return_storage_ptr__->field_1).blockStatement.numStatements = (head->value).line;
  *(undefined4 *)&(__return_storage_ptr__->field_1).breakStatement.pos.file = 0;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)0x0;
  (__return_storage_ptr__->field_1).blockStatement.statements = (Statement *)0x0;
  (__return_storage_ptr__->field_1).routine.isNative = 0;
  if (0 < compiler->indentLevel) {
    printf("\x1b[31m\n[Error] [Line:%d] Routines can only be declared in top level indent!\x1b[0m");
    he = he + 1;
  }
  if (head == (TokenList *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = (head->value).type == TOKEN_FOREIGN;
  }
  if (bVar4) {
    if (head->next != (TokenList *)0x0) {
      head = head->next;
    }
    if (bVar4) {
      (__return_storage_ptr__->field_1).routine.isNative = 1;
    }
  }
  consume(&local_50,TOKEN_IDENTIFIER,"Expected routine name!");
  t.start = (char *)compiler;
  t.type = local_50.length;
  t._4_4_ = local_50.line;
  t.file = (char *)in_stack_ffffffffffffff70._0_8_;
  t.length = in_stack_ffffffffffffff70._8_4_;
  t.line = in_stack_ffffffffffffff70._12_4_;
  pcVar2 = stringOf(t);
  (__return_storage_ptr__->field_1).routine.name = pcVar2;
  consume((Token *)&stack0xffffffffffffff70,TOKEN_LEFT_PAREN,
          "Expected \'(\' after routine declaration!");
  if ((head == (TokenList *)0x0) || ((head->value).type != TOKEN_RIGHT_PAREN)) {
    iVar3 = (__return_storage_ptr__->field_1).ifStatement.thenBranch.numStatements;
    __ptr = (__return_storage_ptr__->field_1).routine.arguments;
    sVar1 = (long)iVar3 * 8;
    do {
      iVar3 = iVar3 + 1;
      __ptr = (char **)realloc(__ptr,sVar1 + 8);
      consume(&local_70,TOKEN_IDENTIFIER,"Expected identifer as argument!");
      t_00.start = (char *)compiler;
      t_00.type = local_70.length;
      t_00._4_4_ = local_70.line;
      t_00.file = (char *)in_stack_ffffffffffffff70._0_8_;
      t_00.length = in_stack_ffffffffffffff70._8_4_;
      t_00.line = in_stack_ffffffffffffff70._12_4_;
      pcVar2 = stringOf(t_00);
      *(char **)((long)__ptr + sVar1) = pcVar2;
      if (head == (TokenList *)0x0) {
        bVar4 = false;
      }
      else {
        bVar4 = (head->value).type == TOKEN_COMMA;
      }
      if (!bVar4) break;
      if (head->next != (TokenList *)0x0) {
        head = head->next;
      }
      sVar1 = sVar1 + 8;
    } while (bVar4);
    *(int *)&(__return_storage_ptr__->field_1).breakStatement.pos.file = iVar3;
    (__return_storage_ptr__->field_1).routine.arguments = __ptr;
    consume((Token *)&stack0xffffffffffffff70,TOKEN_RIGHT_PAREN,
            "Expected \')\' after argument declaration!");
  }
  else if (head->next != (TokenList *)0x0) {
    head = head->next;
  }
  consume((Token *)&stack0xffffffffffffff70,TOKEN_NEWLINE,
          "Expected newline after routine declaration!");
  if ((__return_storage_ptr__->field_1).routine.isNative == 0) {
    BVar5 = blockStatement(compiler,BLOCK_FUNC);
    *(Block *)&(__return_storage_ptr__->field_1).ifStatement.elseBranch.statements = BVar5;
    consume((Token *)&stack0xffffffffffffff70,TOKEN_ENDROUTINE,
            "Expected EndRoutine after routine definition!");
    consume((Token *)&stack0xffffffffffffff70,TOKEN_NEWLINE,
            "Expected newline after routine definition!");
  }
  return __return_storage_ptr__;
}

Assistant:

static Statement routineStatement(Compiler *compiler){
    Statement s;
    s.type = STATEMENT_ROUTINE;
    s.routine.line = presentLine();
    s.routine.arity = 0;
    s.routine.arguments = NULL;   
    s.routine.name = NULL;
    s.routine.isNative = 0;

    if(compiler->indentLevel > 0){
        printf(line_error("Routines can only be declared in top level indent!"), presentLine());
        he++;
    }

    if(match(TOKEN_FOREIGN))
        s.routine.isNative = 1;
    
    s.routine.name = stringOf(consume(TOKEN_IDENTIFIER, "Expected routine name!"));
    consume(TOKEN_LEFT_PAREN, "Expected '(' after routine declaration!");
    if(peek() != TOKEN_RIGHT_PAREN){
        do{
            s.routine.arity++;
            s.routine.arguments = (char **)reallocate(s.routine.arguments, sizeof(char *) * s.routine.arity);
            s.routine.arguments[s.routine.arity - 1] = stringOf(consume(TOKEN_IDENTIFIER, "Expected identifer as argument!"));
        } while(match(TOKEN_COMMA));
        consume(TOKEN_RIGHT_PAREN, "Expected ')' after argument declaration!");
    }
    else
        advance();
    consume(TOKEN_NEWLINE, "Expected newline after routine declaration!");

    if(s.routine.isNative == 0){
        s.routine.code = blockStatement(compiler, BLOCK_FUNC);

        consume(TOKEN_ENDROUTINE, "Expected EndRoutine after routine definition!");
        consume(TOKEN_NEWLINE, "Expected newline after routine definition!");
    }
    return s;
}